

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_n_base.h
# Opt level: O2

void test_uintwide_t_n_base::
     get_equal_random_test_values_boost_and_local_n<math::wide_integer::uintwide_t<24u,unsigned_char,void,false>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<24u,24u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>,void>
               (uintwide_t<24U,_unsigned_char,_void,_false> *u_local,
               number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
               *u_boost,size_t count)

{
  anon_class_32_4_006e9c57 parallel_function;
  enable_if_t<(_false),_uintwide_t<24U,_unsigned_char>_> eVar1;
  enable_if_t<(_false),_uintwide_t<24U,_unsigned_char>_> eVar2;
  uint __res;
  uint uVar3;
  random_engine_type *prVar4;
  atomic_flag rnd_lock;
  distribution_type distribution;
  atomic_flag local_61;
  uintwide_t<24U,_unsigned_char,_void,_false> **local_60;
  number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
  **ppnStack_58;
  undefined2 *local_50;
  atomic_flag *paStack_48;
  undefined2 local_40;
  value_type_conflict4 local_3e;
  undefined2 local_3d;
  value_type_conflict4 local_3b;
  number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
  *local_38;
  uintwide_t<24U,_unsigned_char,_void,_false> *local_30;
  
  local_38 = u_boost;
  local_30 = u_local;
  prVar4 = my_random_generator();
  uVar3 = util::util_pseudorandom_time_point_seed::value<unsigned_int>();
  prVar4->_M_x = uVar3 % 0x7fffffff + (uint)(uVar3 % 0x7fffffff == 0);
  eVar1 = math::wide_integer::uintwide_t<24U,_unsigned_char,_void,_false>::limits_helper_min<false>
                    ();
  eVar2 = math::wide_integer::uintwide_t<24U,_unsigned_char,_void,_false>::limits_helper_max<false>
                    ();
  local_3e = eVar1.values.super_array<unsigned_char,_3UL>.elems[2];
  local_50 = &local_40;
  local_40 = eVar1.values.super_array<unsigned_char,_3UL>.elems._0_2_;
  local_3d = eVar2.values.super_array<unsigned_char,_3UL>.elems._0_2_;
  local_3b = eVar2.values.super_array<unsigned_char,_3UL>.elems[2];
  paStack_48 = &local_61;
  local_61.super___atomic_flag_base._M_i = (__atomic_flag_base)false;
  parallel_function.u_boost = &local_38;
  parallel_function.u_local = &local_30;
  parallel_function.distribution = (distribution_type *)local_50;
  parallel_function.rnd_lock = paStack_48;
  local_60 = &local_30;
  ppnStack_58 = &local_38;
  my_concurrency::
  parallel_for<unsigned_long,test_uintwide_t_n_base::get_equal_random_test_values_boost_and_local_n<math::wide_integer::uintwide_t<24u,unsigned_char,void,false>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<24u,24u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>,void>(math::wide_integer::uintwide_t<24u,unsigned_char,void,false>*,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<24u,24u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>*,unsigned_long)::_lambda(unsigned_long)_1_>
            (0,count,parallel_function);
  return;
}

Assistant:

static auto get_equal_random_test_values_boost_and_local_n(      OtherLocalUintType* u_local,
                                                                     OtherBoostUintType* u_boost,
                                                               const std::size_t         count) -> void
    {
      using other_local_uint_type = OtherLocalUintType;
      using other_boost_uint_type = OtherBoostUintType;

      my_random_generator().seed(util::util_pseudorandom_time_point_seed::value<typename random_engine_type::result_type>());

      #if defined(WIDE_INTEGER_NAMESPACE)
      using distribution_type =
        WIDE_INTEGER_NAMESPACE::math::wide_integer::uniform_int_distribution<other_local_uint_type::my_width2, typename other_local_uint_type::limb_type, AllocatorType>;
      #else
      using distribution_type =
        ::math::wide_integer::uniform_int_distribution<other_local_uint_type::my_width2, typename other_local_uint_type::limb_type, AllocatorType>;
      #endif

      distribution_type distribution;

      std::atomic_flag rnd_lock = ATOMIC_FLAG_INIT;

      my_concurrency::parallel_for
      (
        static_cast<std::size_t>(0U),
        count,
        [&u_local, &u_boost, &distribution, &rnd_lock](std::size_t i)
        {
          while(rnd_lock.test_and_set()) { ; }
          const other_local_uint_type a = distribution(my_random_generator());
          rnd_lock.clear();

          u_local[i] = a;                                                // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
          u_boost[i] = other_boost_uint_type("0x" + hexlexical_cast(a)); // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
        }
      );
    }